

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::createImagesIter(CopyImageTest *this)

{
  ostringstream *poVar1;
  deUint32 internalFormat;
  deUint32 internalFormat_00;
  TestLog *pTVar2;
  State *rng;
  State *pSVar3;
  bool bVar4;
  int iVar5;
  CompressedTexFormat CVar6;
  undefined4 extraout_var;
  ObjectWrapper *pOVar7;
  ObjectTraits *pOVar8;
  ObjectWrapper *this_00;
  deUint32 moreRestrictiveFormat;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  Functions *gl;
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  internalFormat = (this->m_srcImageInfo).m_format;
  internalFormat_00 = (this->m_dstImageInfo).m_format;
  moreRestrictiveFormat = internalFormat;
  if (internalFormat != internalFormat_00) {
    bVar4 = glu::isCompressedFormat(internalFormat);
    if (bVar4) {
      CVar6 = glu::mapGLCompressedTexFormat(internalFormat);
      bVar4 = tcu::isAstcFormat(CVar6);
      if (bVar4) goto LAB_0165855f;
    }
    bVar4 = glu::isCompressedFormat(internalFormat_00);
    if (bVar4) {
      CVar6 = glu::mapGLCompressedTexFormat(internalFormat_00);
      bVar4 = tcu::isAstcFormat(CVar6);
      moreRestrictiveFormat = internalFormat_00;
      if (bVar4) goto LAB_0165855f;
    }
    bVar4 = isFloatFormat(internalFormat);
    moreRestrictiveFormat = internalFormat;
    if ((((!bVar4) &&
         (bVar4 = isFloatFormat(internalFormat_00), moreRestrictiveFormat = internalFormat_00,
         !bVar4)) &&
        (bVar4 = glu::isCompressedFormat(internalFormat), moreRestrictiveFormat = internalFormat,
        !bVar4)) && (bVar4 = glu::isCompressedFormat(internalFormat_00), bVar4)) {
      moreRestrictiveFormat = internalFormat_00;
    }
  }
LAB_0165855f:
  rng = this->m_state;
  pOVar7 = (ObjectWrapper *)operator_new(0x18);
  pOVar8 = glu::objectTraits((uint)((this->m_srcImageInfo).m_target == 0x8d41) * 2);
  glu::ObjectWrapper::ObjectWrapper(pOVar7,gl,pOVar8);
  this->m_state->srcImage = pOVar7;
  this_00 = (ObjectWrapper *)operator_new(0x18);
  pOVar8 = glu::objectTraits((uint)((this->m_dstImageInfo).m_target == 0x8d41) * 2);
  glu::ObjectWrapper::ObjectWrapper(this_00,gl,pOVar8);
  pSVar3 = this->m_state;
  pSVar3->dstImage = this_00;
  pOVar7 = pSVar3->srcImage;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Creating source image.",0x16);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  genImage(gl,&rng->rng,pOVar7->m_object,&pSVar3->srcImageLevels,&this->m_srcImageInfo,
           moreRestrictiveFormat);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Creating destination image.",0x1b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  genImage(gl,&rng->rng,this_00->m_object,&pSVar3->dstImageLevels,&this->m_dstImageInfo,
           moreRestrictiveFormat);
  return;
}

Assistant:

void CopyImageTest::createImagesIter (void)
{
	TestLog&				log						= m_testCtx.getLog();
	glu::RenderContext&		renderContext			= m_context.getRenderContext();
	const glw::Functions&	gl						= renderContext.getFunctions();
	const deUint32			moreRestrictiveFormat	= getMoreRestrictiveFormat(m_srcImageInfo.getFormat(), m_dstImageInfo.getFormat());
	de::Random&				rng						= m_state->rng;

	DE_ASSERT(!m_state->srcImage);
	DE_ASSERT(!m_state->dstImage);

	m_state->srcImage = new glu::ObjectWrapper(gl, getObjectTraits(m_srcImageInfo));
	m_state->dstImage = new glu::ObjectWrapper(gl, getObjectTraits(m_dstImageInfo));

	{
		glu::ObjectWrapper&				srcImage				= *m_state->srcImage;
		glu::ObjectWrapper&				dstImage				= *m_state->dstImage;

		vector<ArrayBuffer<deUint8> >&	srcImageLevels			= m_state->srcImageLevels;
		vector<ArrayBuffer<deUint8> >&	dstImageLevels			= m_state->dstImageLevels;

		log << TestLog::Message << "Creating source image." << TestLog::EndMessage;
		genImage(gl, rng, *srcImage, srcImageLevels, m_srcImageInfo, moreRestrictiveFormat);

		log << TestLog::Message << "Creating destination image." << TestLog::EndMessage;
		genImage(gl, rng, *dstImage, dstImageLevels, m_dstImageInfo, moreRestrictiveFormat);
	}
}